

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O2

void duckdb_brotli::BrotliBuildCodeLengthsHuffmanTable
               (HuffmanCode *table,uint8_t *code_lengths,uint16_t *count)

{
  byte bVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  HuffmanCode *pHVar7;
  uint uVar8;
  long lVar9;
  HuffmanCode HVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar18 [16];
  int local_c8 [4];
  int local_b8;
  int local_b4;
  int local_ac;
  HuffmanCode *local_a8;
  ulong local_a0;
  uint16_t *local_98;
  long local_90;
  HuffmanCode *local_88;
  int offset [6];
  
  auVar5 = _DAT_0216c6c0;
  auVar4 = _DAT_02011120;
  auVar3 = _DAT_01fc9430;
  local_a8 = table;
  local_c8[1] = count[1] - 1;
  local_c8[2] = (uint)count[1] + (uint)count[2] + -1;
  local_c8[3] = (uint)count[3] + local_c8[2];
  local_b8 = (uint)count[4] + local_c8[3];
  local_98 = count;
  local_b4 = (uint)count[5] + local_b8;
  local_c8[0] = 0x11;
  lVar6 = 0;
  do {
    iVar2 = local_c8[code_lengths[lVar6 + 0x11]];
    local_c8[code_lengths[lVar6 + 0x11]] = iVar2 + -1;
    iVar16 = (int)lVar6;
    offset[(long)iVar2 + 2] = iVar16 + 0x11;
    iVar2 = local_c8[code_lengths[lVar6 + 0x10]];
    local_c8[code_lengths[lVar6 + 0x10]] = iVar2 + -1;
    offset[(long)iVar2 + 2] = iVar16 + 0x10;
    iVar2 = local_c8[code_lengths[lVar6 + 0xf]];
    local_c8[code_lengths[lVar6 + 0xf]] = iVar2 + -1;
    offset[(long)iVar2 + 2] = iVar16 + 0xf;
    iVar2 = local_c8[code_lengths[lVar6 + 0xe]];
    local_c8[code_lengths[lVar6 + 0xe]] = iVar2 + -1;
    offset[(long)iVar2 + 2] = iVar16 + 0xe;
    iVar2 = local_c8[code_lengths[lVar6 + 0xd]];
    local_c8[code_lengths[lVar6 + 0xd]] = iVar2 + -1;
    offset[(long)iVar2 + 2] = iVar16 + 0xd;
    iVar2 = local_c8[code_lengths[lVar6 + 0xc]];
    local_c8[code_lengths[lVar6 + 0xc]] = iVar2 + -1;
    offset[(long)iVar2 + 2] = iVar16 + 0xc;
    lVar6 = lVar6 + -6;
  } while (lVar6 != -0x12);
  if (local_c8[0] == 0) {
    for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 1) {
      local_a8[lVar6] = (HuffmanCode)(offset[2] << 0x10);
    }
  }
  else {
    local_ac = 2;
    lVar6 = 1;
    lVar11 = 0;
    local_a0 = 0x80;
    lVar13 = 0;
    do {
      uVar8 = (uint)local_98[lVar6];
      lVar9 = (long)-local_ac;
      lVar13 = (long)(int)lVar13;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = (long)local_ac;
      auVar18 = (ZEXT816(0) << 0x40 | ZEXT816(0x1f)) / auVar18;
      iVar2 = auVar18._0_4_;
      auVar15._0_8_ = auVar18._0_8_;
      auVar15._8_4_ = iVar2;
      auVar15._12_4_ = 0;
      local_88 = local_a8 + -(long)local_ac;
      local_90 = lVar9 * 0xc + 0x80;
      offset[0] = (int)lVar9;
      offset[1] = (int)((ulong)lVar9 >> 0x20);
      auVar15 = auVar15 ^ auVar3;
      while (bVar14 = uVar8 != 0, uVar8 = uVar8 - 1, bVar14) {
        HVar10 = (HuffmanCode)(offset[lVar13 + 2] << 0x10 | (uint)lVar6);
        bVar1 = ""[lVar11];
        uVar12 = 0;
        pHVar7 = local_a8 + -(long)local_ac;
        do {
          auVar17._8_4_ = (int)uVar12;
          auVar17._0_8_ = uVar12;
          auVar17._12_4_ = (int)(uVar12 >> 0x20);
          auVar18 = (auVar17 | auVar4) ^ auVar3;
          iVar16 = auVar15._4_4_;
          if ((bool)(~(iVar16 < auVar18._4_4_ ||
                      auVar15._0_4_ < auVar18._0_4_ && auVar18._4_4_ == iVar16) & 1)) {
            pHVar7[(ulong)bVar1 + 0x20] = HVar10;
          }
          if (auVar18._12_4_ <= auVar15._12_4_ &&
              (auVar18._8_4_ <= auVar15._8_4_ || auVar18._12_4_ != auVar15._12_4_)) {
            pHVar7[lVar9 + (ulong)bVar1 + 0x20] = HVar10;
          }
          auVar18 = (auVar17 | auVar5) ^ auVar3;
          iVar19 = auVar18._4_4_;
          if (iVar19 <= iVar16 && (iVar19 != iVar16 || auVar18._0_4_ <= auVar15._0_4_)) {
            pHVar7[(ulong)bVar1 + lVar9 * 2 + 0x20] = HVar10;
            pHVar7[(ulong)bVar1 + lVar9 * 3 + 0x20] = HVar10;
          }
          uVar12 = uVar12 + 4;
          pHVar7 = pHVar7 + lVar9 * 4;
        } while ((iVar2 + 4U & 0x3c) != uVar12);
        lVar13 = lVar13 + 1;
        lVar11 = lVar11 + local_a0;
      }
      local_ac = local_ac * 2;
      local_a0 = local_a0 >> 1;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliBuildCodeLengthsHuffmanTable(HuffmanCode* table,
                                        const uint8_t* const code_lengths,
                                        uint16_t* count) {
  HuffmanCode code;       /* current table entry */
  int symbol;             /* symbol index in original or sorted table */
  brotli_reg_t key;       /* prefix code */
  brotli_reg_t key_step;  /* prefix code addend */
  int step;               /* step size to replicate values in current table */
  int table_size;         /* size of current table */
  int sorted[BROTLI_CODE_LENGTH_CODES];  /* symbols sorted by code length */
  /* offsets in sorted table for each length */
  int offset[BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1];
  int bits;
  int bits_count;
  BROTLI_DCHECK(BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH <=
                BROTLI_REVERSE_BITS_MAX);
  BROTLI_DCHECK(BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH == 5);

  /* Generate offsets into sorted symbol table by code length. */
  symbol = -1;
  bits = 1;
  /* BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH == 5 */
  BROTLI_REPEAT_5({
    symbol += count[bits];
    offset[bits] = symbol;
    bits++;
  });
  /* Symbols with code length 0 are placed after all other symbols. */
  offset[0] = BROTLI_CODE_LENGTH_CODES - 1;

  /* Sort symbols by length, by symbol order within each length. */
  symbol = BROTLI_CODE_LENGTH_CODES;
  do {
    BROTLI_REPEAT_6({
      symbol--;
      sorted[offset[code_lengths[symbol]]--] = symbol;
    });
  } while (symbol != 0);

  table_size = 1 << BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH;

  /* Special case: all symbols but one have 0 code length. */
  if (offset[0] == 0) {
    code = ConstructHuffmanCode(0, (uint16_t)sorted[0]);
    for (key = 0; key < (brotli_reg_t)table_size; ++key) {
      table[key] = code;
    }
    return;
  }

  /* Fill in table. */
  key = 0;
  key_step = BROTLI_REVERSE_BITS_LOWEST;
  symbol = 0;
  bits = 1;
  step = 2;
  do {
    for (bits_count = count[bits]; bits_count != 0; --bits_count) {
      code = ConstructHuffmanCode((uint8_t)bits, (uint16_t)sorted[symbol++]);
      ReplicateValue(&table[BrotliReverseBits(key)], step, table_size, code);
      key += key_step;
    }
    step <<= 1;
    key_step >>= 1;
  } while (++bits <= BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH);
}